

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::flipinsertfacet
          (tetgenmesh *this,arraypool *crosstets,arraypool *toppoints,arraypool *botpoints,
          arraypool *midpoints)

{
  ulong uVar1;
  char **ppcVar2;
  arraypool *paVar3;
  tetrahedron *pppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  tetrahedron ppdVar8;
  double *pdVar9;
  badface *pbVar10;
  memorypool *pmVar11;
  tetrahedron ppdVar12;
  double *pdVar13;
  undefined8 uVar14;
  arraypool *paVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  point pdVar19;
  point pdVar20;
  int iVar21;
  char *pcVar22;
  long lVar23;
  uint *puVar24;
  tetrahedron *pppdVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  double dVar33;
  badface *pqueue;
  point plane_pc;
  point plane_pb;
  point plane_pa;
  flipconstraints fc;
  double ori [3];
  int local_1d4;
  badface *local_1c8;
  long local_1c0;
  long local_1b8;
  tetrahedron local_1b0;
  int local_1a4;
  arraypool *local_1a0;
  triface local_198;
  ulong local_188;
  uint local_180 [2];
  ulong local_178;
  uint local_170;
  ulong local_168;
  undefined4 local_160;
  ulong local_138;
  point local_130;
  point local_128;
  point local_120;
  double local_118;
  long local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  long local_f0;
  double *local_e8;
  tetrahedron local_e0;
  arraypool *local_d8;
  arraypool *local_d0;
  flipconstraints local_c8;
  double adStack_48 [3];
  
  lVar23 = 8;
  do {
    *(undefined8 *)((long)&local_1a0 + lVar23) = 0;
    *(undefined4 *)((long)&local_198.tet + lVar23) = 0;
    lVar23 = lVar23 + 0x10;
  } while (lVar23 != 0x68);
  local_c8.seg[0] = (point)0x0;
  local_c8.fac[0] = (point)0x0;
  local_c8.remvert = (point)0x0;
  local_c8.enqflag = 0;
  local_c8.chkencflag = 0;
  local_c8.unflip = 0;
  local_c8.collectnewtets = 0;
  local_c8.collectencsegflag = 0;
  local_c8.remove_ndelaunay_edge = 0;
  local_c8.bak_tetprism_vol._0_4_ = 0;
  local_c8.bak_tetprism_vol._4_4_ = 0;
  local_c8.tetprism_vol_sum._0_4_ = 0;
  local_c8._36_8_ = 0;
  local_c8.cosdihed_in = 0.0;
  local_c8.cosdihed_out = 0.0;
  local_c8.checkflipeligibility = 0;
  local_100 = this->flip23count;
  local_f8 = this->flip32count;
  local_f0 = this->flip44count;
  calculateabovepoint(this,midpoints,&local_120,&local_128,&local_130);
  lVar23 = toppoints->objects;
  if (0 < lVar23) {
    ppcVar2 = toppoints->toparray;
    lVar28 = 0;
    do {
      uVar32 = *(uint *)(*(long *)(ppcVar2[(uint)lVar28 >>
                                           ((byte)toppoints->log2objectsperblock & 0x1f)] +
                                  (long)toppoints->objectbytes *
                                  (long)(int)(toppoints->objectsperblockmark & (uint)lVar28)) + 4 +
                        (long)this->pointmarkindex * 4);
      if ((uVar32 & 2) == 0) {
        *(uint *)(*(long *)(ppcVar2[(uint)lVar28 >> ((byte)toppoints->log2objectsperblock & 0x1f)] +
                           (long)toppoints->objectbytes *
                           (long)(int)(toppoints->objectsperblockmark & (uint)lVar28)) + 4 +
                 (long)this->pointmarkindex * 4) = uVar32 | 4;
      }
      lVar28 = lVar28 + 1;
    } while (lVar23 != lVar28);
  }
  lVar23 = botpoints->objects;
  if (0 < lVar23) {
    ppcVar2 = botpoints->toparray;
    lVar28 = 0;
    do {
      uVar32 = *(uint *)(*(long *)(ppcVar2[(uint)lVar28 >>
                                           ((byte)botpoints->log2objectsperblock & 0x1f)] +
                                  (long)botpoints->objectbytes *
                                  (long)(int)(botpoints->objectsperblockmark & (uint)lVar28)) + 4 +
                        (long)this->pointmarkindex * 4);
      if ((uVar32 & 2) == 0) {
        *(uint *)(*(long *)(ppcVar2[(uint)lVar28 >> ((byte)botpoints->log2objectsperblock & 0x1f)] +
                           (long)botpoints->objectbytes *
                           (long)(int)(botpoints->objectsperblockmark & (uint)lVar28)) + 4 +
                 (long)this->pointmarkindex * 4) = uVar32 | 8;
      }
      lVar28 = lVar28 + 1;
    } while (lVar23 != lVar28);
  }
  paVar3 = this->cavetetlist;
  lVar23 = crosstets->objects;
  local_d8 = toppoints;
  local_d0 = botpoints;
  if (0 < lVar23) {
    lVar28 = 0;
    do {
      lVar23 = *(long *)(crosstets->toparray
                         [(uint)lVar28 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
                        (long)crosstets->objectbytes *
                        (long)(int)(crosstets->objectsperblockmark & (uint)lVar28));
      lVar27 = 0;
      do {
        if ((*(uint *)((*(ulong *)(lVar23 + lVar27 * 8) & 0xfffffffffffffff0) +
                      (long)this->elemmarkerindex * 4) & 3) == 1) {
          pcVar22 = arraypool::getblock(paVar3,(int)paVar3->objects);
          lVar29 = (long)paVar3->objectbytes *
                   ((long)paVar3->objectsperblock - 1U & paVar3->objects);
          paVar3->objects = paVar3->objects + 1;
          *(long *)(pcVar22 + lVar29) = lVar23;
          *(int *)(pcVar22 + lVar29 + 8) = (int)lVar27;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 4);
      puVar24 = (uint *)(lVar23 + (long)this->elemmarkerindex * 4);
      *puVar24 = *puVar24 | 2;
      lVar28 = lVar28 + 1;
      lVar23 = crosstets->objects;
    } while (lVar28 < lVar23);
  }
  if (1 < this->b->verbose) {
    printf("    Found %ld crossing faces.\n");
    lVar23 = crosstets->objects;
  }
  pdVar20 = local_128;
  pdVar19 = local_130;
  if (0 < lVar23) {
    ppcVar2 = crosstets->toparray;
    lVar28 = 0;
    do {
      lVar27 = *(long *)(ppcVar2[(uint)lVar28 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
                        (long)crosstets->objectbytes *
                        (long)(int)(crosstets->objectsperblockmark & (uint)lVar28));
      puVar24 = (uint *)(lVar27 + (long)this->elemmarkerindex * 4);
      *puVar24 = *puVar24 & 0xfffffffd;
      puVar24 = (uint *)(lVar27 + (long)this->elemmarkerindex * 4);
      *puVar24 = *puVar24 & 0xfffffffe;
      lVar28 = lVar28 + 1;
    } while (lVar23 != lVar28);
  }
  local_1c8 = (badface *)0x0;
  if (0 < paVar3->objects) {
    lVar23 = 0;
    do {
      flipcertify(this,(triface *)
                       (paVar3->toparray[(uint)lVar23 >> ((byte)paVar3->log2objectsperblock & 0x1f)]
                       + (long)paVar3->objectbytes *
                         (long)(int)(paVar3->objectsperblockmark & (uint)lVar23)),&local_1c8,
                  local_120,pdVar20,pdVar19);
      lVar23 = lVar23 + 1;
    } while (lVar23 < paVar3->objects);
  }
  pbVar10 = local_1c8;
  paVar3->objects = 0;
  local_1a0 = (arraypool *)operator_new(0x30);
  local_1a0->objectbytes = 0x10;
  local_1a0->objectsperblock = 0x10;
  local_1a0->log2objectsperblock = 4;
  local_1a0->objectsperblockmark = 0xf;
  local_1a0->toparraylen = 0;
  local_1a0->toparray = (char **)0x0;
  local_1a0->objects = 0;
  local_138 = 0;
  local_1a0->totalmemory = 0;
  if (pbVar10 != (badface *)0x0) {
    lVar23 = 0x10;
    lVar28 = 0;
    local_1c8 = pbVar10;
    do {
      pppdVar4 = (local_1c8->tt).tet;
      uVar32 = (local_1c8->tt).ver;
      dVar33 = local_1c8->key;
      ppdVar5 = (tetrahedron)local_1c8->forg;
      ppdVar6 = (tetrahedron)local_1c8->fdest;
      ppdVar7 = (tetrahedron)local_1c8->fapex;
      ppdVar8 = (tetrahedron)local_1c8->foppo;
      pdVar9 = local_1c8->noppo;
      pbVar10 = local_1c8->nextitem;
      pmVar11 = this->flippool;
      (local_1c8->tt).tet = (tetrahedron *)pmVar11->deaditemstack;
      pmVar11->deaditemstack = local_1c8;
      pmVar11->items = pmVar11->items + -1;
      local_1c8 = pbVar10;
      if (((((pppdVar4 != (tetrahedron *)0x0) && (pppdVar4[4] != (tetrahedron)0x0)) &&
           (pppdVar4[orgpivot[(int)uVar32]] == ppdVar5)) &&
          ((pppdVar4[destpivot[(int)uVar32]] == ppdVar6 &&
           (pppdVar4[apexpivot[(int)uVar32]] == ppdVar7)))) &&
         (ppdVar12 = pppdVar4[oppopivot[(int)uVar32]], ppdVar12 == ppdVar8)) {
        uVar31 = (ulong)pppdVar4[uVar32 & 3] & 0xfffffffffffffff0;
        lVar27 = (long)fsymtbl[(int)uVar32][(uint)pppdVar4[uVar32 & 3] & 0xf];
        pdVar13 = *(double **)(uVar31 + (long)oppopivot[lVar27] * 8);
        local_1b8 = lVar23;
        if (pdVar13 == pdVar9) {
          local_1c0 = lVar28;
          local_1b0 = ppdVar6;
          local_118 = dVar33;
          local_110 = lVar27;
          local_108 = uVar31;
          local_e8 = pdVar13;
          local_e0 = ppdVar12;
          if (2 < this->b->verbose) {
            lVar23 = (long)this->pointmarkindex;
            printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",dVar33,
                   (ulong)*(uint *)((long)ppdVar5 + lVar23 * 4),
                   (ulong)*(uint *)((long)ppdVar6 + lVar23 * 4),
                   (ulong)*(uint *)((long)ppdVar7 + lVar23 * 4),
                   (ulong)*(uint *)((long)ppdVar8 + lVar23 * 4),
                   (ulong)*(uint *)((long)pdVar9 + lVar23 * 4));
          }
          lVar23 = 0;
          local_1d4 = 3;
          local_1a4 = 0;
          do {
            dVar33 = orient3d((double *)pppdVar4[orgpivot[(int)uVar32]],
                              (double *)pppdVar4[destpivot[(int)uVar32]],(double *)local_e0,local_e8
                             );
            paVar15 = local_1a0;
            adStack_48[lVar23] = dVar33;
            if (0.0 <= dVar33) {
              if ((dVar33 == 0.0) && (!NAN(dVar33))) {
                local_1d4 = local_1d4 + -1;
                local_1a4 = local_1a4 + 1;
              }
            }
            else {
              local_1d4 = local_1d4 + -1;
            }
            uVar32 = enexttbl[(int)uVar32];
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          if (local_1d4 == 3) {
            local_188 = local_108;
            local_180[0] = (uint)local_110;
            local_198.tet = pppdVar4;
            local_198.ver = uVar32;
            flip23(this,&local_198,1,&local_c8);
            lVar23 = paVar3->objects;
            lVar28 = 8;
            do {
              uVar14 = *(undefined8 *)((long)&local_1a0 + lVar28);
              iVar26 = eprevesymtbl[*(int *)((long)&local_198.tet + lVar28)];
              pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
              lVar27 = (long)paVar3->objectbytes *
                       ((long)paVar3->objectsperblock - 1U & paVar3->objects);
              lVar23 = paVar3->objects + 1;
              paVar3->objects = lVar23;
              *(undefined8 *)(pcVar22 + lVar27) = uVar14;
              *(int *)(pcVar22 + lVar27 + 8) = iVar26;
              lVar28 = lVar28 + 0x10;
            } while (lVar28 != 0x38);
            lVar28 = 8;
            do {
              uVar14 = *(undefined8 *)((long)&local_1a0 + lVar28);
              iVar26 = enextesymtbl[*(int *)((long)&local_198.tet + lVar28)];
              pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
              lVar27 = (long)paVar3->objectbytes *
                       ((long)paVar3->objectsperblock - 1U & paVar3->objects);
              lVar23 = paVar3->objects + 1;
              paVar3->objects = lVar23;
              *(undefined8 *)(pcVar22 + lVar27) = uVar14;
              *(int *)(pcVar22 + lVar27 + 8) = iVar26;
              lVar28 = lVar28 + 0x10;
            } while (lVar28 != 0x38);
          }
          else {
            if (local_1d4 != 2) {
              lVar23 = local_1b8;
              lVar28 = local_1c0;
              if (2 < this->b->verbose) {
                lVar23 = (long)this->pointmarkindex;
                printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",local_118,
                       (ulong)*(uint *)((long)ppdVar5 + lVar23 * 4),
                       (ulong)*(uint *)((long)local_1b0 + lVar23 * 4),
                       (ulong)*(uint *)((long)ppdVar7 + lVar23 * 4),
                       (ulong)*(uint *)((long)ppdVar8 + lVar23 * 4),
                       (ulong)*(uint *)((long)pdVar9 + lVar23 * 4));
                lVar23 = local_1b8;
                lVar28 = local_1c0;
              }
              goto LAB_00131ebe;
            }
            lVar23 = 0;
            do {
              if (adStack_48[lVar23] <= 0.0) break;
              uVar32 = enexttbl[(int)uVar32];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 3);
            local_198.ver = esymtbl[(int)uVar32];
            iVar26 = this->pointmarkindex;
            puVar24 = local_180;
            pppdVar25 = pppdVar4;
            uVar31 = 0;
            uVar30 = local_198.ver;
            do {
              if ((*(byte *)((long)pppdVar25[apexpivot[(int)uVar30]] + (long)iVar26 * 4 + 4) & 0xe)
                  == 0) goto LAB_00131e72;
              uVar1 = uVar31 + 1;
              ppdVar5 = pppdVar25[facepivot1[(int)uVar30]];
              pppdVar25 = (tetrahedron *)((ulong)ppdVar5 & 0xfffffffffffffff0);
              *(tetrahedron **)(puVar24 + -2) = pppdVar25;
              uVar30 = facepivot2[(int)uVar30][(uint)ppdVar5 & 0xf];
              *puVar24 = uVar30;
              uVar18 = local_168;
              uVar17 = local_170;
              uVar16 = local_178;
            } while ((uVar31 < 4) && (puVar24 = puVar24 + 4, uVar31 = uVar1, pppdVar4 != pppdVar25))
            ;
            if (uVar1 == 3) {
              local_198.tet = pppdVar4;
              flip32(this,&local_198,1,&local_c8);
              lVar23 = paVar3->objects;
              iVar26 = 3;
              do {
                pppdVar4 = local_198.tet;
                iVar21 = esymtbl[local_198.ver];
                pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
                lVar28 = (long)paVar3->objectbytes *
                         ((long)paVar3->objectsperblock - 1U & paVar3->objects);
                lVar23 = paVar3->objects + 1;
                paVar3->objects = lVar23;
                *(tetrahedron **)(pcVar22 + lVar28) = pppdVar4;
                *(int *)(pcVar22 + lVar28 + 8) = iVar21;
                local_198.ver = enexttbl[local_198.ver];
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
              iVar26 = 3;
              do {
                uVar31 = local_188;
                iVar21 = esymtbl[(int)local_180[0]];
                pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
                lVar28 = (long)paVar3->objectbytes *
                         ((long)paVar3->objectsperblock - 1U & paVar3->objects);
                lVar23 = paVar3->objects + 1;
                paVar3->objects = lVar23;
                *(ulong *)(pcVar22 + lVar28) = uVar31;
                *(int *)(pcVar22 + lVar28 + 8) = iVar21;
                local_180[0] = enexttbl[(int)local_180[0]];
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
            }
            else {
              if (local_1a4 != 1 || uVar1 != 4) {
LAB_00131e72:
                local_198.tet = pppdVar4;
                pcVar22 = arraypool::getblock(local_1a0,(int)local_1c0);
                iVar26 = paVar15->objectbytes;
                lVar23 = ((long)paVar15->objectsperblock - 1U & paVar15->objects) * (long)iVar26;
                lVar28 = paVar15->objects + 1;
                paVar15->objects = lVar28;
                *(tetrahedron **)(pcVar22 + lVar23) = pppdVar4;
                *(uint *)(pcVar22 + lVar23 + 8) = uVar32;
                lVar23 = (long)iVar26;
                goto LAB_00131ebe;
              }
              local_1b0 = (tetrahedron)CONCAT44(local_1b0._4_4_,local_160);
              local_198.tet = pppdVar4;
              local_198.ver = uVar32;
              flip23(this,&local_198,1,&local_c8);
              lVar23 = paVar3->objects;
              lVar28 = 0x18;
              do {
                uVar14 = *(undefined8 *)((long)&local_1a0 + lVar28);
                iVar26 = eprevesymtbl[*(int *)((long)&local_198.tet + lVar28)];
                pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
                lVar27 = (long)paVar3->objectbytes *
                         ((long)paVar3->objectsperblock - 1U & paVar3->objects);
                lVar23 = paVar3->objects + 1;
                paVar3->objects = lVar23;
                *(undefined8 *)(pcVar22 + lVar27) = uVar14;
                *(int *)(pcVar22 + lVar27 + 8) = iVar26;
                lVar28 = lVar28 + 0x10;
              } while (lVar28 != 0x38);
              lVar28 = 0x18;
              do {
                uVar14 = *(undefined8 *)((long)&local_1a0 + lVar28);
                iVar26 = enextesymtbl[*(int *)((long)&local_198.tet + lVar28)];
                pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
                lVar27 = (long)paVar3->objectbytes *
                         ((long)paVar3->objectsperblock - 1U & paVar3->objects);
                lVar23 = paVar3->objects + 1;
                paVar3->objects = lVar23;
                *(undefined8 *)(pcVar22 + lVar27) = uVar14;
                *(int *)(pcVar22 + lVar27 + 8) = iVar26;
                lVar28 = lVar28 + 0x10;
              } while (lVar28 != 0x38);
              local_198.ver = eprevtbl[enextesymtbl[local_198.ver]];
              local_188 = uVar16;
              local_180[0] = uVar17;
              local_178 = uVar18;
              local_170 = (uint)local_1b0;
              flip32(this,&local_198,1,&local_c8);
              local_198.ver = enexttbl[local_198.ver];
              lVar23 = paVar3->objects;
              iVar26 = 2;
              do {
                pppdVar4 = local_198.tet;
                iVar21 = esymtbl[local_198.ver];
                pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
                lVar28 = (long)paVar3->objectbytes *
                         ((long)paVar3->objectsperblock - 1U & paVar3->objects);
                lVar23 = paVar3->objects + 1;
                paVar3->objects = lVar23;
                *(tetrahedron **)(pcVar22 + lVar28) = pppdVar4;
                *(int *)(pcVar22 + lVar28 + 8) = iVar21;
                local_198.ver = enexttbl[local_198.ver];
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
              local_180[0] = enexttbl[(int)local_180[0]];
              iVar26 = 2;
              do {
                uVar31 = local_188;
                iVar21 = esymtbl[(int)local_180[0]];
                pcVar22 = arraypool::getblock(paVar3,(int)lVar23);
                lVar28 = (long)paVar3->objectbytes *
                         ((long)paVar3->objectsperblock - 1U & paVar3->objects);
                lVar23 = paVar3->objects + 1;
                paVar3->objects = lVar23;
                *(ulong *)(pcVar22 + lVar28) = uVar31;
                *(int *)(pcVar22 + lVar28 + 8) = iVar21;
                local_180[0] = enexttbl[(int)local_180[0]];
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
              this->flip23count = this->flip23count + -1;
              this->flip32count = this->flip32count + -1;
              this->flip44count = this->flip44count + 1;
            }
          }
          pdVar20 = local_128;
          pdVar19 = local_130;
          if (0 < lVar23) {
            lVar23 = 0;
            do {
              flipcertify(this,(triface *)
                               (paVar3->toparray
                                [(uint)lVar23 >> ((byte)paVar3->log2objectsperblock & 0x1f)] +
                               (long)paVar3->objectbytes *
                               (long)(int)(paVar3->objectsperblockmark & (uint)lVar23)),&local_1c8,
                          local_120,pdVar20,pdVar19);
              lVar23 = lVar23 + 1;
            } while (lVar23 < paVar3->objects);
          }
          pdVar20 = local_128;
          pdVar19 = local_130;
          paVar3->objects = 0;
          lVar23 = local_1b8;
          if (0 < local_1c0) {
            ppcVar2 = local_1a0->toparray;
            iVar26 = local_1a0->log2objectsperblock;
            uVar32 = local_1a0->objectsperblockmark;
            lVar27 = 0;
            lVar28 = local_1c0;
            do {
              iVar21 = (uVar32 & (uint)lVar27) * (int)lVar23;
              lVar29 = *(long *)(ppcVar2[(uint)lVar27 >> ((byte)iVar26 & 0x1f)] + iVar21);
              if ((lVar29 != 0) && (*(long *)(lVar29 + 0x20) != 0)) {
                flipcertify(this,(triface *)
                                 (ppcVar2[(uint)lVar27 >> ((byte)iVar26 & 0x1f)] + iVar21),
                            &local_1c8,local_120,pdVar20,pdVar19);
                lVar28 = local_1c0;
                lVar23 = local_1b8;
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 < lVar28);
          }
          local_1a0->objects = 0;
          local_138 = (ulong)((int)local_138 + 1);
          lVar28 = 0;
        }
      }
LAB_00131ebe:
    } while (local_1c8 != (badface *)0x0);
    if (0 < lVar28 && (int)local_138 == 0) {
      printf("!! No flip is found in %ld faces.\n",lVar28);
      puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
      puts("  the message above, your input data set, and the exact");
      puts("  command line you used to run this program, thank you.");
      exit(2);
    }
  }
  paVar3 = local_1a0;
  arraypool::~arraypool(local_1a0);
  operator_delete(paVar3,0x30);
  lVar23 = local_d8->objects;
  if (0 < lVar23) {
    ppcVar2 = local_d8->toparray;
    lVar28 = 0;
    do {
      puVar24 = (uint *)(*(long *)(ppcVar2[(uint)lVar28 >>
                                           ((byte)local_d8->log2objectsperblock & 0x1f)] +
                                  (long)local_d8->objectbytes *
                                  (long)(int)(local_d8->objectsperblockmark & (uint)lVar28)) + 4 +
                        (long)this->pointmarkindex * 4);
      *puVar24 = *puVar24 & 0xfffffffb;
      lVar28 = lVar28 + 1;
    } while (lVar23 != lVar28);
  }
  lVar23 = local_d0->objects;
  if (0 < lVar23) {
    ppcVar2 = local_d0->toparray;
    lVar28 = 0;
    do {
      puVar24 = (uint *)(*(long *)(ppcVar2[(uint)lVar28 >>
                                           ((byte)local_d0->log2objectsperblock & 0x1f)] +
                                  (long)local_d0->objectbytes *
                                  (long)(int)(local_d0->objectsperblockmark & (uint)lVar28)) + 4 +
                        (long)this->pointmarkindex * 4);
      *puVar24 = *puVar24 & 0xfffffff7;
      lVar28 = lVar28 + 1;
    } while (lVar23 != lVar28);
  }
  if (2 < this->b->verbose) {
    printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
           (this->flip32count - local_f8) + (this->flip23count - local_100) +
           (this->flip44count - local_f0));
  }
  return;
}

Assistant:

void tetgenmesh::flipinsertfacet(arraypool *crosstets, arraypool *toppoints,
                                 arraypool *botpoints, arraypool *midpoints)
{
  arraypool *crossfaces, *bfacearray;
  triface fliptets[6], baktets[2], fliptet, newface;
  triface neightet, *parytet;
  badface *pqueue;
  badface *popbf, bface;
  point plane_pa, plane_pb, plane_pc;
  point p1, p2, pd, pe;
  point *parypt;
  flipconstraints fc;
  REAL ori[3];
  int convcount, copcount;
  int flipflag, fcount;
  int n, i;
  long f23count, f32count, f44count;
  long totalfcount;

  f23count = flip23count;
  f32count = flip32count;
  f44count = flip44count;

  // Get three affinely independent vertices in the missing region R.
  calculateabovepoint(midpoints, &plane_pa, &plane_pb, &plane_pc);

  // Mark top and bottom points. Do not mark midpoints.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest2(*parypt);
    }
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    if (!pmarktested(*parypt)) {
      pmarktest3(*parypt);
    }
  }

  // Collect crossing faces. 
  crossfaces = cavetetlist;  // Re-use array 'cavetetlist'.

  // Each crossing face contains at least one bottom vertex and
  //   one top vertex.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    fliptet = *parytet;
    for (fliptet.ver = 0; fliptet.ver < 4; fliptet.ver++) {
      fsym(fliptet, neightet);
      if (infected(neightet)) { // It is an interior face.
        if (!marktested(neightet)) { // It is an unprocessed face.
          crossfaces->newindex((void **) &parytet);
          *parytet = fliptet;
        }
      }
    }
    marktest(fliptet);
  }

  if (b->verbose > 1) {
    printf("    Found %ld crossing faces.\n", crossfaces->objects);
  }

  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    unmarktest(*parytet);
    uninfect(*parytet);
  }

  // Initialize the priority queue.
  pqueue = NULL;

  for (i = 0; i < crossfaces->objects; i++) {
    parytet = (triface *) fastlookup(crossfaces, i);
    flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
  }
  crossfaces->restart();

  // The list for temporarily storing unflipable faces.
  bfacearray = new arraypool(sizeof(triface), 4);


  fcount = 0;  // Count the number of flips.

  // Flip insert the facet.
  while (pqueue != NULL) {

    // Pop a face from the priority queue.
    popbf = pqueue;
    bface = *popbf;
    // Update the queue.
    pqueue = pqueue->nextitem;
    // Delete the popped item from the pool.
    flippool->dealloc((void *) popbf);

    if (!isdeadtet(bface.tt)) {
      if ((org(bface.tt) == bface.forg) && (dest(bface.tt) == bface.fdest) &&
          (apex(bface.tt) == bface.fapex) && (oppo(bface.tt) == bface.foppo)) {
        // It is still a crossing face of R.
        fliptet = bface.tt;
        fsym(fliptet, neightet);
        if (oppo(neightet) == bface.noppo) {
          pd = oppo(fliptet);
          pe = oppo(neightet);

          if (b->verbose > 2) {
            printf("      Get face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                   pointmark(bface.forg), pointmark(bface.fdest),
                   pointmark(bface.fapex), pointmark(bface.foppo),
                   pointmark(bface.noppo), bface.key);
          }
          flipflag = 0;

          // Check for which type of flip can we do.
          convcount = 3;
          copcount = 0;
          for (i = 0; i < 3; i++) {
            p1 = org(fliptet);
            p2 = dest(fliptet);
            ori[i] = orient3d(p1, p2, pd, pe);
            if (ori[i] < 0) {
              convcount--;
              //break;
            } else if (ori[i] == 0) {
              convcount--; // Possible 4-to-4 flip.
              copcount++;
              //break;
            }
            enextself(fliptet);
          }

          if (convcount == 3) {
            // A 2-to-3 flip is found.
            fliptets[0] = fliptet; // abcd, d may be the new vertex.
            fliptets[1] = neightet; // bace.
            flip23(fliptets, 1, &fc);
            // Put the link faces into check list.
            for (i = 0; i < 3; i++) {
              eprevesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            for (i = 0; i < 3; i++) {
              enextesym(fliptets[i], newface);
              crossfaces->newindex((void **) &parytet);
              *parytet = newface;
            }
            flipflag = 1;
          } else if (convcount == 2) {
            //if (copcount <= 1) {
            // A 3-to-2 or 4-to-4 may be possible.
            // Get the edge which is locally non-convex or flat. 
            for (i = 0; i < 3; i++) {
              if (ori[i] <= 0) break;
              enextself(fliptet);
            }

            // Collect tets sharing at this edge.
            esym(fliptet, fliptets[0]); // [b,a,d,c]
            n = 0;
            do {
              p1 = apex(fliptets[n]);
              if (!(pmarktested(p1) || pmarktest2ed(p1) || pmarktest3ed(p1))) {
                // This apex is not on the cavity. Hence the face does not
                //   lie inside the cavity. Do not flip this edge.
                n = 1000; break;
              }
              fnext(fliptets[n], fliptets[n + 1]);
              n++;
            } while ((fliptets[n].tet != fliptet.tet) && (n < 5));

            if (n == 3) {
              // Found a 3-to-2 flip.
              flip32(fliptets, 1, &fc);
              // Put the link faces into check list.
              for (i = 0; i < 3; i++) {
                esym(fliptets[0], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[0]);
              }
              for (i = 0; i < 3; i++) {
                esym(fliptets[1], newface);
                crossfaces->newindex((void **) &parytet);
                *parytet = newface;
                enextself(fliptets[1]);
              }
              flipflag = 1;
            } else if (n == 4) {
              if (copcount == 1) {                
                // Found a 4-to-4 flip. 
                // Let the six vertices are: a,b,c,d,e,f, where
                //   fliptets[0] = [b,a,d,c]
                //           [1] = [b,a,c,e]
                //           [2] = [b,a,e,f]
                //           [3] = [b,a,f,d]
                // After the 4-to-4 flip, edge [a,b] is flipped, edge [e,d]
                //   is created.
                // First do a 2-to-3 flip.
                // Comment: This flip temporarily creates a degenerated
                //   tet (whose volume is zero). It will be removed by the 
                //   followed 3-to-2 flip.
                fliptets[0] = fliptet; // = [a,b,c,d], d is the new vertex.
                // fliptets[1];        // = [b,a,c,e].
                baktets[0] = fliptets[2]; // = [b,a,e,f]
                baktets[1] = fliptets[3]; // = [b,a,f,d]
                // The flip may involve hull tets.
                flip23(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [e,d,a,b] => will be flipped, so 
                //   [a,b,d] and [a,b,e] are not "outer" link faces.
                for (i = 1; i < 3; i++) {
                  eprevesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                for (i = 1; i < 3; i++) {
                  enextesym(fliptets[i], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                }
                // Then do a 3-to-2 flip.
                enextesymself(fliptets[0]);  // fliptets[0] is [e,d,a,b].
                eprevself(fliptets[0]); // = [b,a,d,c], d is the new vertex.
                fliptets[1] = baktets[0]; // = [b,a,e,f]
                fliptets[2] = baktets[1]; // = [b,a,f,d]
                flip32(fliptets, 1, &fc);
                // Put the "outer" link faces into check list.
                //   fliptets[0] = [d,e,f,a]
                //   fliptets[1] = [e,d,f,b]
                //   Faces [a,b,d] and [a,b,e] are not "outer" link faces.
                enextself(fliptets[0]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[0], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[0]);
                }
                enextself(fliptets[1]);
                for (i = 1; i < 3; i++) {
                  esym(fliptets[1], newface);
                  crossfaces->newindex((void **) &parytet);
                  *parytet = newface;
                  enextself(fliptets[1]);
                }
                flip23count--;
                flip32count--;
                flip44count++;
                flipflag = 1;
              }
            }
          } else {
            // There are more than 1 non-convex or coplanar cases.
            flipflag = -1; // Ignore this face.
            if (b->verbose > 2) {
              printf("        Ignore face (%d, %d, %d) - %d, %d, tau = %.17g\n",
                     pointmark(bface.forg), pointmark(bface.fdest),
                     pointmark(bface.fapex), pointmark(bface.foppo),
                     pointmark(bface.noppo), bface.key);
            }
          } // if (convcount == 1)

          if (flipflag == 1) {
            // Update the priority queue.
            for (i = 0; i < crossfaces->objects; i++) {
              parytet = (triface *) fastlookup(crossfaces, i);
              flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
            }
            crossfaces->restart();
            if (1) { // if (!b->flipinsert_random) {
              // Insert all queued unflipped faces.
              for (i = 0; i < bfacearray->objects; i++) {
                parytet = (triface *) fastlookup(bfacearray, i);
                // This face may be changed.
                if (!isdeadtet(*parytet)) {
                  flipcertify(parytet, &pqueue, plane_pa, plane_pb, plane_pc);
                }
              }
              bfacearray->restart();
            }
            fcount++;
          } else if (flipflag == 0) {
            // Queue an unflippable face. To process it later.
            bfacearray->newindex((void **) &parytet);
            *parytet = fliptet;
          }
        } // if (pe == bface.noppo)  
      } // if ((pa == bface.forg) && ...)
    } // if (bface.tt != NULL)

  } // while (pqueue != NULL)

  if (bfacearray->objects > 0) {
    if (fcount == 0) {
      printf("!! No flip is found in %ld faces.\n", bfacearray->objects);
      terminatetetgen(this, 2); //assert(0);
    }
  }

  delete bfacearray;

  // Un-mark top and bottom points.
  for (i = 0; i < toppoints->objects; i++) {
    parypt = (point *) fastlookup(toppoints, i);
    punmarktest2(*parypt);
  }
  for (i = 0; i < botpoints->objects; i++) {
    parypt = (point *) fastlookup(botpoints, i);
    punmarktest3(*parypt);
  }

  f23count = flip23count - f23count;
  f32count = flip32count - f32count;
  f44count = flip44count - f44count;
  totalfcount = f23count + f32count + f44count;
  if (b->verbose > 2) {
    printf("      Total %ld flips. f23(%ld), f32(%ld), f44(%ld).\n",
           totalfcount, f23count, f32count, f44count);
  }
}